

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
          (basic_appender<char> out,unsigned_long value,format_specs *specs)

{
  int value_00;
  make_unsigned_t<int> mVar1;
  basic_appender<char> bVar2;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_30;
  
  value_00 = count_digits<4,unsigned_long>(value);
  mVar1 = to_unsigned<int>(value_00);
  local_30.value = value;
  local_30.num_digits = value_00;
  if (specs == (format_specs *)0x0) {
    bVar2 = reserve<char>(out,(ulong)mVar1 + 2);
    bVar2 = write_ptr<char,_fmt::v11::basic_appender<char>,_unsigned_long>::anon_class_16_2_92d121e5
            ::operator()(&local_30,bVar2.container);
  }
  else {
    bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,unsigned_long,fmt::v11::format_specs_const*)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,(ulong)mVar1 + 2,&local_30);
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value, const format_specs* specs)
    -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_base2e<Char>(4, it, value, num_digits);
  };
  return specs ? write_padded<Char, align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}